

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O2

int __thiscall
TPZSkylMatrix<double>::Decompose_Cholesky
          (TPZSkylMatrix<double> *this,list<long,_std::allocator<long>_> *singular)

{
  char cVar1;
  double **ppdVar2;
  double *pdVar3;
  double **ppdVar4;
  undefined1 auVar5 [16];
  TPZSkylMatrix<double> *pTVar6;
  int iVar7;
  undefined4 extraout_var;
  double *pdVar8;
  ulong uVar9;
  ostream *poVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  double *pdVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  double extraout_XMM0_Qa;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar39;
  double dVar40;
  undefined1 auVar38 [16];
  double dVar41;
  double in_XMM7_Qa;
  double in_XMM7_Qb;
  undefined1 auVar42 [16];
  double local_78;
  list<long,_std::allocator<long>_> *local_70;
  double local_68;
  undefined8 uStack_60;
  TPZSkylMatrix<double> *local_50;
  double local_48;
  double dStack_40;
  
  cVar1 = (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed;
  local_70 = singular;
  if (cVar1 != '\0') {
    if (cVar1 == '\x03') {
      return 1;
    }
    TPZMatrix<double>::Error
              ("virtual int TPZSkylMatrix<double>::Decompose_Cholesky(std::list<int64_t> &) [TVar = double]"
               ,"Decompose_Cholesky <Matrix already Decomposed>");
  }
  std::__cxx11::list<long,_std::allocator<long>_>::clear(local_70);
  iVar7 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0xc])(this);
  local_48 = 0.0;
  dStack_40 = -0.0;
  local_78 = 0.0;
  auVar21 = _DAT_012bc100;
  auVar42 = _DAT_012bc110;
  local_50 = this;
  do {
    pTVar6 = local_50;
    if (CONCAT44(extraout_var,iVar7) <= (long)local_78) {
      lVar13 = (local_50->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar13 != 0) &&
         ((*(local_50->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x24])(local_50,lVar13 + -1), ABS(extraout_XMM0_Qa) < 1e-15)) {
        local_78 = (double)((pTVar6->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow + -1);
        std::__cxx11::list<long,_std::allocator<long>_>::push_back
                  (local_70,(value_type_conflict5 *)&local_78);
        lVar13 = (pTVar6->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow + -1;
        local_78 = 1.0;
        (*(pTVar6->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x23])(pTVar6,lVar13,lVar13,&local_78);
      }
      (pTVar6->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed = '\x03';
      (pTVar6->super_TPZMatrix<double>).super_TPZBaseMatrix.fDefPositive = '\x01';
      return 1;
    }
    ppdVar2 = (local_50->fElem).fStore;
    pdVar3 = ppdVar2[(long)local_78];
    pdVar16 = ppdVar2[(long)local_78 + 1];
    if (pdVar16 == pdVar3) {
      return 0;
    }
    dVar36 = 0.0;
    if (8 < (long)pdVar16 - (long)pdVar3) {
      pdVar8 = pdVar3 + 2;
      if (pdVar3 + 2 < pdVar16) {
        pdVar8 = pdVar16;
      }
      uVar9 = (long)pdVar8 + (-9 - (long)pdVar3);
      auVar25._8_4_ = (int)uVar9;
      auVar25._0_8_ = uVar9;
      auVar25._12_4_ = (int)(uVar9 >> 0x20);
      auVar20._0_8_ = uVar9 >> 3;
      auVar20._8_8_ = auVar25._8_8_ >> 3;
      auVar20 = auVar20 ^ auVar42;
      uVar11 = 0;
      dVar36 = local_48;
      dVar39 = dStack_40;
      do {
        dVar41 = dVar39;
        dVar35 = dVar36;
        auVar24._8_4_ = (int)uVar11;
        auVar24._0_8_ = uVar11;
        auVar24._12_4_ = (int)(uVar11 >> 0x20);
        auVar25 = (auVar24 | auVar21) ^ auVar42;
        auVar29._0_4_ = -(uint)(auVar20._0_4_ < auVar25._0_4_);
        auVar29._4_4_ = -(uint)(auVar20._4_4_ < auVar25._4_4_);
        auVar29._8_4_ = -(uint)(auVar20._8_4_ < auVar25._8_4_);
        auVar29._12_4_ = -(uint)(auVar20._12_4_ < auVar25._12_4_);
        auVar26._4_4_ = -(uint)(auVar25._4_4_ == auVar20._4_4_);
        auVar26._12_4_ = -(uint)(auVar25._12_4_ == auVar20._12_4_);
        auVar26._0_4_ = auVar26._4_4_;
        auVar26._8_4_ = auVar26._12_4_;
        auVar27._4_4_ = auVar29._4_4_;
        auVar27._0_4_ = auVar29._4_4_;
        auVar27._8_4_ = auVar29._12_4_;
        auVar27._12_4_ = auVar29._12_4_;
        auVar25 = auVar26 & auVar29 | auVar27;
        dVar36 = dVar35;
        dVar39 = dVar41;
        if ((~auVar25._0_4_ & 1) != 0) {
          dVar36 = pdVar3[uVar11 + 1];
          dVar39 = 0.0;
        }
        auVar5._8_4_ = 0xffffffff;
        auVar5._0_8_ = 0xffffffffffffffff;
        auVar5._12_4_ = 0xffffffff;
        if (((auVar25 ^ auVar5) & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          dVar39 = pdVar3[uVar11 + 2];
        }
        dVar36 = dVar36 * dVar36 + dVar35;
        dVar39 = dVar39 * dVar39 + dVar41;
        uVar11 = uVar11 + 2;
      } while (((uVar9 >> 3) + 2 & 0xfffffffffffffffe) != uVar11);
      auVar21._4_4_ = auVar29._0_4_;
      auVar21._0_4_ = auVar29._0_4_;
      auVar21._8_4_ = auVar29._8_4_;
      auVar21._12_4_ = auVar29._8_4_;
      auVar27 = auVar26 & auVar21 | auVar27;
      uVar9 = auVar27._0_8_;
      uVar11 = auVar27._8_8_;
      dVar36 = (double)(~uVar11 & (ulong)dVar39 | (ulong)dVar41 & uVar11) +
               (double)(~uVar9 & (ulong)dVar36 | (ulong)dVar35 & uVar9);
    }
    dVar36 = *pdVar3 - dVar36;
    if (ABS(dVar36) < 1e-12) {
      uStack_60 = 0;
      local_68 = dVar36;
      std::__cxx11::list<long,_std::allocator<long>_>::push_back
                (local_70,(value_type_conflict5 *)&local_78);
      poVar10 = std::operator<<((ostream *)&std::cout,"Decompose_Cholesky");
      std::operator<<(poVar10," Singular equation pivot ");
      poVar10 = std::ostream::_M_insert<double>(local_68);
      poVar10 = std::operator<<(poVar10," k ");
      poVar10 = std::ostream::_M_insert<long>((long)poVar10);
      std::endl<char,std::char_traits<char>>(poVar10);
      dVar36 = 1.0;
    }
    if (dVar36 < 0.0) {
      dVar36 = sqrt(dVar36);
    }
    else {
      dVar36 = SQRT(dVar36);
    }
    auVar42 = _DAT_012bc110;
    auVar21 = _DAT_012bc100;
    local_68 = local_78;
    ppdVar2 = (pTVar6->fElem).fStore;
    pdVar3 = ppdVar2[(long)local_78];
    *pdVar3 = dVar36;
    ppdVar4 = (pTVar6->fElem).fStore;
    uVar9 = (ulong)((long)pdVar16 + (-8 - (long)pdVar3)) >> 3;
    uVar12 = (uint)uVar9;
    uVar9 = uVar9 & 0xffffffff;
    lVar13 = 0x18;
    lVar14 = -0x10;
    lVar15 = 2;
    dVar39 = local_78;
    while (dVar35 = (double)((long)dVar39 + 1), (long)dVar35 < CONCAT44(extraout_var,iVar7)) {
      lVar19 = (long)ppdVar4[(long)dVar39 + 2] - (long)ppdVar4[(long)dVar35] >> 3;
      if (lVar15 < lVar19) {
        pdVar16 = ppdVar2[(long)dVar35];
        pdVar8 = pdVar16 + lVar15;
        uVar18 = (uint)((ulong)((long)ppdVar2[(long)dVar39 + 2] - (long)pdVar8) >> 3);
        if (uVar12 < uVar18) {
          uVar18 = uVar12;
        }
        if (uVar18 == 0) {
          dVar39 = 0.0;
        }
        else {
          uVar11 = (ulong)((long)ppdVar2[(long)dVar39 + 2] + (lVar14 - (long)pdVar16)) >> 3 &
                   0xffffffff;
          if (uVar9 <= uVar11) {
            uVar11 = uVar9;
          }
          lVar19 = uVar11 - 1;
          auVar22._8_4_ = (int)lVar19;
          auVar22._0_8_ = lVar19;
          auVar22._12_4_ = (int)((ulong)lVar19 >> 0x20);
          uVar17 = 0;
          dVar39 = 0.0;
          dVar41 = -0.0;
          do {
            dVar40 = dVar41;
            dVar37 = dVar39;
            auVar30._8_4_ = (int)uVar17;
            auVar30._0_8_ = uVar17;
            auVar30._12_4_ = (int)(uVar17 >> 0x20);
            auVar38 = auVar22 ^ auVar42;
            auVar25 = (auVar30 | auVar21) ^ auVar42;
            auVar34._0_4_ = -(uint)(auVar38._0_4_ < auVar25._0_4_);
            auVar34._4_4_ = -(uint)(auVar38._4_4_ < auVar25._4_4_);
            auVar34._8_4_ = -(uint)(auVar38._8_4_ < auVar25._8_4_);
            auVar34._12_4_ = -(uint)(auVar38._12_4_ < auVar25._12_4_);
            auVar31._4_4_ = -(uint)(auVar25._4_4_ == auVar38._4_4_);
            auVar31._12_4_ = -(uint)(auVar25._12_4_ == auVar38._12_4_);
            auVar31._0_4_ = auVar31._4_4_;
            auVar31._8_4_ = auVar31._12_4_;
            auVar32._4_4_ = auVar34._4_4_;
            auVar32._0_4_ = auVar34._4_4_;
            auVar32._8_4_ = auVar34._12_4_;
            auVar32._12_4_ = auVar34._12_4_;
            auVar25 = auVar31 & auVar34 | auVar32;
            if ((~auVar25._0_4_ & 1) != 0) {
              auVar38._8_8_ = 0;
              auVar38._0_8_ = *(ulong *)((long)pdVar16 + uVar17 * 8 + lVar13 + -8);
              in_XMM7_Qa = pdVar3[uVar17 + 1];
              in_XMM7_Qb = 0.0;
            }
            if (((auVar25._8_2_ ^ 0xffff) & 1) != 0) {
              auVar38._8_8_ = *(undefined8 *)((long)pdVar16 + uVar17 * 8 + lVar13);
              in_XMM7_Qb = pdVar3[uVar17 + 2];
            }
            dVar39 = auVar38._0_8_ * in_XMM7_Qa + dVar37;
            dVar41 = auVar38._8_8_ * in_XMM7_Qb + dVar40;
            uVar17 = uVar17 + 2;
          } while ((uVar11 + 1 & 0xfffffffffffffffe) != uVar17);
          auVar23._4_4_ = auVar34._0_4_;
          auVar23._0_4_ = auVar34._0_4_;
          auVar23._8_4_ = auVar34._8_4_;
          auVar23._12_4_ = auVar34._8_4_;
          auVar32 = auVar31 & auVar23 | auVar32;
          uVar11 = auVar32._0_8_;
          auVar28._0_8_ = (ulong)dVar37 & uVar11;
          uVar17 = auVar32._8_8_;
          auVar28._8_8_ = (ulong)dVar40 & uVar17;
          auVar33._0_8_ = ~uVar11 & (ulong)dVar39;
          auVar33._8_8_ = ~uVar17 & (ulong)dVar41;
          dVar39 = SUB168(auVar33 | auVar28,8) + SUB168(auVar33 | auVar28,0);
        }
        pdVar16 = pdVar8 + -1;
        dVar39 = pdVar8[-1] - dVar39;
LAB_00d4ce51:
        *pdVar16 = dVar39 / dVar36;
      }
      else if (lVar19 == lVar15) {
        pdVar16 = ppdVar2[(long)dVar35] + lVar15 + -1;
        dVar39 = *pdVar16;
        goto LAB_00d4ce51;
      }
      lVar15 = lVar15 + 1;
      lVar14 = lVar14 + -8;
      lVar13 = lVar13 + 8;
      dVar39 = dVar35;
    }
    local_78 = (double)((long)local_78 + 1);
  } while( true );
}

Assistant:

int
TPZSkylMatrix<TVar>::Decompose_Cholesky(std::list<int64_t> &singular)
{
	if(this->fDecomposed == ECholesky) return 1;
	if (  this->fDecomposed )  TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__, "Decompose_Cholesky <Matrix already Decomposed>" );
    
#ifdef DUMP_BEFORE_DECOMPOSE
	dump_matrix(this, "TPZSkylMatrix::Decompose_Cholesky(singular)");
#endif
    
	singular.clear();
	TVar pivot;
	RTVar Tol;
	ZeroTolerance(Tol);
	int64_t dimension = this->Dim();
	/*  if(Dim() > 100) {
	 cout << "\nTPZSkylMatrix Cholesky decomposition Dim = " << Dim() << endl;
	 cout.flush();
	 }*/
	for ( int64_t k = 0; k < dimension; k++ )
	{
		/*    if(!(k%100) && Dim() > 100) {
		 cout <<  k << ' ';
		 cout.flush();
		 }
		 if(!(k%1000)) cout << endl;*/
		if ( Size(k) == 0 )	return( 0 );
		
		// Faz sum = SOMA( A(k,p) * A(k,p) ), p = 1, ..., k-1.
		//
		TVar sum = 0.0;
		TVar *elem_k = fElem[k]+1;
		TVar *end_k  = fElem[k]+Size(k);
        if constexpr (is_complex<TVar>::value){
            for ( ; elem_k < end_k; elem_k++ ) sum += std::conj(*elem_k) * (*elem_k);
        }else{
#pragma clang loop vectorize_width(2)
            for ( ; elem_k < end_k; elem_k++ ) sum += (*elem_k) * (*elem_k);
        }

		
		// Faz A(k,k) = sqrt( A(k,k) - sum ).
		//
		pivot = fElem[k][0] - sum;
        //		if ( pivot < ((TVar)1.e-9) ) {
		if(abs(pivot) < Tol) {
			singular.push_back(k);
            std::cout << __FUNCTION__ << " Singular equation pivot " << pivot << " k " << k << std::endl;
			pivot = 1.;
		}
		// A matriz nao e' definida positiva.
		
		pivot = fElem[k][0] = sqrt( pivot );
		
		// Loop para i = k+1 ... Dim().
		//
		int64_t i=k+1;
		for ( int64_t j = 2; i<dimension; j++,i++ ) {
			// Se tiverem elementos na linha 'i' cuja coluna e'
			//  menor do que 'K'...
			if ( Size(i) > j ) {
				// Faz sum = SOMA( A(i,p) * A(k,p) ), p = 1,..,k-1.
				sum = 0.0;
				TVar *elem_i = &fElem[i][j];
				TVar *end_i  = fElem[i+1];
				elem_k = &(fElem[k][1]);
				// Vectorizable loop
				unsigned max_l = end_i - elem_i;
				unsigned tmp = end_k - elem_k;
				if (tmp < max_l) max_l = tmp;
                if constexpr (is_complex<TVar>::value){
                    for(unsigned l=0; l<max_l; l++) 
                        sum += (*elem_i++) * std::conj(*elem_k++);
                }else{
#pragma clang loop vectorize_width(2)
                    for(unsigned l=0; l<max_l; l++) 
                        sum += (*elem_i++) * (*elem_k++);
                }

				// Faz A(i,k) = (A(i,k) - sum) / A(k,k)
				fElem[i][j-1] = (fElem[i][j-1] -sum) / pivot;
			} else if ( Size(i) == j ) fElem[i][j-1] /= pivot;
			
			// Se nao tiverem estes elementos, sum = 0.0.
			
			// Se nao existir nem o elemento A(i,k), nao faz nada.
		}
	}
	
	if(this->Rows() && fabs(GetVal(this->Rows()-1,this->Rows()-1)) < fabs((TVar)1.e-15))
	{
		singular.push_back(this->Rows()-1);
		PutVal(this->Rows()-1,this->Rows()-1,1.);
	}
	this->fDecomposed  = ECholesky;
	this->fDefPositive = 1;
	return( 1 );
}